

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O2

size_t __thiscall Imf_3_2::DeepTiledInputFile::totalTiles(DeepTiledInputFile *this)

{
  LevelMode LVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Data *pDVar5;
  ArgExc *this_00;
  int i_l;
  int iVar6;
  int iVar7;
  int i_lx;
  
  pDVar5 = this->_data;
  LVar1 = (pDVar5->tileDesc).mode;
  if (LVar1 < RIPMAP_LEVELS) {
    iVar6 = 0;
    iVar7 = 0;
    while( true ) {
      iVar2 = numLevels(this);
      if (iVar2 <= iVar6) break;
      iVar2 = numXTiles(this,iVar6);
      iVar3 = numYTiles(this,iVar6);
      iVar7 = iVar7 + iVar3 * iVar2;
      iVar6 = iVar6 + 1;
    }
  }
  else {
    if (LVar1 != RIPMAP_LEVELS) {
      this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc(this_00,"Unknown LevelMode format.");
      __cxa_throw(this_00,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
    }
    iVar7 = 0;
    for (iVar6 = 0; iVar6 < pDVar5->numYLevels; iVar6 = iVar6 + 1) {
      for (iVar2 = 0; iVar2 < pDVar5->numXLevels; iVar2 = iVar2 + 1) {
        iVar3 = numXTiles(this,iVar2);
        iVar4 = numYTiles(this,iVar6);
        iVar7 = iVar7 + iVar4 * iVar3;
        pDVar5 = this->_data;
      }
    }
  }
  return (long)iVar7;
}

Assistant:

size_t
DeepTiledInputFile::totalTiles () const
{
    //
    // Calculate the total number of tiles in the file
    //

    int numAllTiles = 0;

    switch (levelMode ())
    {
        case ONE_LEVEL:
        case MIPMAP_LEVELS:

            for (int i_l = 0; i_l < numLevels (); ++i_l)
                numAllTiles += numXTiles (i_l) * numYTiles (i_l);

            break;

        case RIPMAP_LEVELS:

            for (int i_ly = 0; i_ly < numYLevels (); ++i_ly)
                for (int i_lx = 0; i_lx < numXLevels (); ++i_lx)
                    numAllTiles += numXTiles (i_lx) * numYTiles (i_ly);

            break;

        default: throw IEX_NAMESPACE::ArgExc ("Unknown LevelMode format.");
    }
    return numAllTiles;
}